

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLineTestRunner.cpp
# Opt level: O2

int CommandLineTestRunner::RunAllTests(int ac,char **av)

{
  int iVar1;
  TestRegistry *pTVar2;
  char *s;
  CommandLineTestRunner runner;
  ConsoleTestOutput backupOutput;
  MemoryLeakWarningPlugin memLeakWarn;
  
  ConsoleTestOutput::ConsoleTestOutput(&backupOutput);
  SimpleString::SimpleString((SimpleString *)&runner,"MemoryLeakPlugin");
  MemoryLeakWarningPlugin::MemoryLeakWarningPlugin
            (&memLeakWarn,(SimpleString *)&runner,(MemoryLeakDetector *)0x0);
  SimpleString::~SimpleString((SimpleString *)&runner);
  MemoryLeakWarningPlugin::destroyGlobalDetectorAndTurnOffMemoryLeakDetectionInDestructor
            (&memLeakWarn,true);
  pTVar2 = TestRegistry::getCurrentRegistry();
  (*pTVar2->_vptr_TestRegistry[0xd])(pTVar2,&memLeakWarn);
  pTVar2 = TestRegistry::getCurrentRegistry();
  CommandLineTestRunner(&runner,ac,av,pTVar2);
  iVar1 = runAllTestsMain(&runner);
  ~CommandLineTestRunner(&runner);
  if (iVar1 == 0) {
    s = MemoryLeakWarningPlugin::FinalReport(&memLeakWarn,0);
    operator<<(&backupOutput.super_TestOutput,s);
  }
  pTVar2 = TestRegistry::getCurrentRegistry();
  SimpleString::SimpleString((SimpleString *)&runner,"MemoryLeakPlugin");
  (*pTVar2->_vptr_TestRegistry[0x11])(pTVar2,&runner);
  SimpleString::~SimpleString((SimpleString *)&runner);
  MemoryLeakWarningPlugin::~MemoryLeakWarningPlugin(&memLeakWarn);
  TestOutput::~TestOutput(&backupOutput.super_TestOutput);
  return iVar1;
}

Assistant:

int CommandLineTestRunner::RunAllTests(int ac, const char *const *av)
{
    int result = 0;
    ConsoleTestOutput backupOutput;

    MemoryLeakWarningPlugin memLeakWarn(DEF_PLUGIN_MEM_LEAK);
    memLeakWarn.destroyGlobalDetectorAndTurnOffMemoryLeakDetectionInDestructor(true);
    TestRegistry::getCurrentRegistry()->installPlugin(&memLeakWarn);

    {
        CommandLineTestRunner runner(ac, av, TestRegistry::getCurrentRegistry());
        result = runner.runAllTestsMain();
    }

    if (result == 0) {
        backupOutput << memLeakWarn.FinalReport(0);
    }
    TestRegistry::getCurrentRegistry()->removePluginByName(DEF_PLUGIN_MEM_LEAK);
    return result;
}